

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmath.c
# Opt level: O1

double * xvm_new(uint64_t N)

{
  int iVar1;
  double *local_10;
  
  iVar1 = posix_memalign(&local_10,0x10,N * 8 + 0x18 & 0xffffffffffffffe0);
  if (iVar1 != 0) {
    local_10 = (double *)0x0;
  }
  if (local_10 != (double *)0x0) {
    return local_10;
  }
  fatal("out of memory");
}

Assistant:

double *xvm_new(uint64_t N) {
#if defined(__SSE2__) && !defined(XVM_ANSI)
	if (N % 4 != 0)
		N += 4 - N % 4;
	void *ptr = _mm_malloc(sizeof(double) * N, 16);
	if (ptr == NULL)
		fatal("out of memory");
	return ptr;
#else
	return xmalloc(sizeof(double) * N);
#endif
}